

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t scratch_seq_read(_internal_exr_seq_scratch *scr,void *buf,uint64_t sz)

{
  exr_const_context_t_conflict p_Var1;
  exr_result_t eVar2;
  exr_result_t eVar3;
  uint64_t notdone;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  int64_t nread;
  int64_t local_48;
  uint64_t *local_40;
  uint64_t local_38;
  
  if (sz == 0) {
    return 0;
  }
  local_40 = &scr->fileoff;
  eVar2 = -1;
  uVar6 = 0;
  local_38 = sz;
  do {
    uVar5 = scr->navail;
    if ((long)uVar5 < 1) {
      if (sz < 0x1000) {
        local_48 = 0;
        p_Var1 = scr->ctxt;
        uVar5 = p_Var1->file_size;
        if ((long)uVar5 < 1) {
          uVar4 = 1;
        }
        else {
          uVar4 = uVar5 - *local_40;
          if (*local_40 + 0x1000 <= uVar5) {
            uVar4 = 0x1000;
          }
        }
        eVar2 = (*p_Var1->do_read)(p_Var1,scr->scratch,uVar4,local_40,&local_48,EXR_ALLOW_SHORT_READ
                                  );
        if (local_48 < 1) {
          if (local_48 == 0) {
            eVar2 = (*scr->ctxt->report_error)(scr->ctxt,10,"End of file attempting to read header")
            ;
          }
          goto LAB_00127883;
        }
        scr->navail = local_48;
        scr->curpos = 0;
      }
      else {
        local_48 = 0;
        eVar2 = (*scr->ctxt->do_read)
                          (scr->ctxt,buf,sz & 0xfffffffffffff000,local_40,&local_48,
                           EXR_MUST_READ_ALL);
        if (local_48 < 1) goto LAB_00127883;
        sz = sz - local_48;
        buf = (void *)((long)buf + local_48);
        uVar6 = uVar6 + local_48;
      }
    }
    else {
      if (sz < uVar5) {
        uVar5 = sz;
      }
      memcpy(buf,scr->scratch + scr->curpos,uVar5);
      scr->curpos = scr->curpos + uVar5;
      scr->navail = scr->navail - uVar5;
      sz = sz - uVar5;
      buf = (void *)((long)buf + uVar5);
      uVar6 = uVar6 + uVar5;
    }
    if (sz == 0) {
LAB_00127883:
      eVar3 = 10;
      if (uVar6 == local_38) {
        eVar3 = 0;
      }
      if (eVar2 != -1) {
        eVar3 = eVar2;
      }
      return eVar3;
    }
  } while( true );
}

Assistant:

static exr_result_t
scratch_seq_read (struct _internal_exr_seq_scratch* scr, void* buf, uint64_t sz)
{
    uint8_t*     outbuf  = buf;
    uint64_t     nCopied = 0;
    uint64_t     notdone = sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            memcpy (outbuf, scr->scratch + scr->curpos, nCopy);
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            outbuf += nCopy;
            nCopied += nCopy;
        }
        else if (notdone >= SCRATCH_BUFFER_SIZE)
        {
            uint64_t nPages  = notdone / SCRATCH_BUFFER_SIZE;
            int64_t  nread   = 0;
            uint64_t nToRead = nPages * SCRATCH_BUFFER_SIZE;
            rv               = scr->ctxt->do_read (
                scr->ctxt,
                outbuf,
                nToRead,
                &(scr->fileoff),
                &nread,
                EXR_MUST_READ_ALL);
            if (nread > 0)
            {
                notdone -= (uint64_t) nread;
                outbuf += nread;
                nCopied += (uint64_t) nread;
            }
            else { break; }
        }
        else
        {
            int64_t nread = 0;
            uint64_t toread = SCRATCH_BUFFER_SIZE;

            if (scr->ctxt->file_size > 0)
            {
                if ((scr->fileoff + SCRATCH_BUFFER_SIZE) > scr->ctxt->file_size)
                {
                    toread = scr->ctxt->file_size - scr->fileoff;
                }
            }
            else
            {
                /*
                 * hrm, stream only with no known size, just read 1 byte at a
                 * time to be safer
                 */
                toread = 1;
            }

            rv = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                toread,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}